

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O3

REF_STATUS ref_cell_with_face(REF_CELL ref_cell,REF_INT *face_nodes,REF_INT *cell0,REF_INT *cell1)

{
  int iVar1;
  int iVar2;
  REF_ADJ pRVar3;
  REF_INT *pRVar4;
  REF_INT *pRVar5;
  REF_ADJ_ITEM pRVar6;
  uint uVar7;
  int *piVar8;
  undefined8 uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  char *pcVar13;
  long lVar14;
  REF_INT ncandidate;
  REF_INT ntarget;
  REF_INT orig [27];
  REF_INT candidate [27];
  REF_INT target [27];
  uint local_1a0;
  uint local_19c;
  long local_198;
  int *local_190;
  REF_INT local_188 [28];
  REF_INT local_118 [28];
  REF_INT local_a8 [30];
  
  *cell0 = -1;
  *cell1 = -1;
  uVar7 = ref_sort_unique_int(4,face_nodes,(REF_INT *)&local_19c,local_a8);
  if (uVar7 == 0) {
    iVar1 = *face_nodes;
    uVar7 = 0;
    if (((-1 < (long)iVar1) && (pRVar3 = ref_cell->ref_adj, uVar7 = 0, iVar1 < pRVar3->nnode)) &&
       (local_198 = (long)pRVar3->first[iVar1], local_198 != -1)) {
      pRVar6 = pRVar3->item + local_198;
      uVar10 = (ulong)(uint)ref_cell->face_per;
      local_190 = cell1;
      while( true ) {
        if (0 < (int)uVar10) {
          iVar1 = pRVar6->ref;
          lVar14 = 0;
          lVar11 = 0;
          do {
            pRVar4 = ref_cell->c2n;
            iVar2 = ref_cell->size_per;
            pRVar5 = ref_cell->f2n;
            lVar12 = 0;
            do {
              local_188[lVar12] =
                   pRVar4[(long)*(int *)((long)pRVar5 + lVar12 * 4 + lVar14) +
                          (long)iVar2 * (long)iVar1];
              lVar12 = lVar12 + 1;
            } while (lVar12 != 4);
            uVar7 = ref_sort_unique_int(4,local_188,(REF_INT *)&local_1a0,local_118);
            if (uVar7 != 0) {
              pcVar13 = "c uniq";
              uVar9 = 0x463;
              goto LAB_0011aecc;
            }
            if (local_19c == local_1a0) {
              if ((int)local_19c < 1) {
                uVar7 = 0;
              }
              else {
                uVar10 = 0;
                uVar7 = 0;
                do {
                  uVar7 = uVar7 + (local_a8[uVar10] == local_118[uVar10]);
                  uVar10 = uVar10 + 1;
                } while (local_19c != uVar10);
              }
              if (local_19c == uVar7) {
                piVar8 = cell0;
                if ((*cell0 != -1) && (piVar8 = local_190, *local_190 != -1)) {
                  return 3;
                }
                *piVar8 = iVar1;
              }
            }
            lVar11 = lVar11 + 1;
            uVar10 = (ulong)ref_cell->face_per;
            lVar14 = lVar14 + 0x10;
          } while (lVar11 < (long)uVar10);
        }
        pRVar6 = ref_cell->ref_adj->item;
        local_198 = (long)pRVar6[(int)local_198].next;
        if (local_198 == -1) break;
        pRVar6 = pRVar6 + local_198;
      }
      uVar7 = 0;
    }
  }
  else {
    pcVar13 = "t uniq";
    uVar9 = 0x45c;
LAB_0011aecc:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",uVar9,
           "ref_cell_with_face",(ulong)uVar7,pcVar13);
  }
  return uVar7;
}

Assistant:

REF_FCN REF_STATUS ref_cell_with_face(REF_CELL ref_cell, REF_INT *face_nodes,
                                      REF_INT *cell0, REF_INT *cell1) {
  REF_INT item, node, same, cell_face, cell;
  REF_INT ntarget, target[REF_CELL_MAX_SIZE_PER];
  REF_INT ncandidate, candidate[REF_CELL_MAX_SIZE_PER];
  REF_INT orig[REF_CELL_MAX_SIZE_PER];

  (*cell0) = REF_EMPTY;
  (*cell1) = REF_EMPTY;

  RSS(ref_sort_unique_int(4, face_nodes, &ntarget, target), "t uniq");

  each_ref_cell_having_node(ref_cell, face_nodes[0], item, cell) {
    each_ref_cell_cell_face(ref_cell, cell_face) {
      for (node = 0; node < 4; node++) {
        orig[node] = ref_cell_f2n(ref_cell, node, cell_face, cell);
      }
      RSS(ref_sort_unique_int(4, orig, &ncandidate, candidate), "c uniq");

      if (ntarget == ncandidate) {
        same = 0;
        for (node = 0; node < ntarget; node++) {
          if (target[node] == candidate[node]) same++;
        }

        if (ntarget == same) {
          if (REF_EMPTY == *cell0) {
            (*cell0) = cell;
          } else {
            if (REF_EMPTY != *cell1)
              return REF_INVALID; /* more than 2 cells with face */
            (*cell1) = cell;
          }
        }
      }
    }
  }

  return REF_SUCCESS;
}